

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintCharAndCodeTo<unsigned_char,signed_char>(char c,ostream *os)

{
  long *plVar1;
  size_type *psVar2;
  int value;
  int value_00;
  int iVar3;
  undefined7 in_register_00000039;
  char *pcVar4;
  bool bVar5;
  string local_60;
  string local_40;
  
  pcVar4 = "\'";
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar3 = (int)CONCAT71(in_register_00000039,c);
  switch(CONCAT71(in_register_00000039,c) & 0xffffffff) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
    goto LAB_001397e1;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_00139659_caseD_1:
    bVar5 = (int)c - 0x7fU < 0xffffffa1;
    if (bVar5) {
      String::FormatHexInt_abi_cxx11_(&local_40,(String *)(ulong)(byte)c,value);
      plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x143030);
      psVar2 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_60.field_2._M_allocated_capacity = *psVar2;
        local_60.field_2._8_8_ = plVar1[3];
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      }
      else {
        local_60.field_2._M_allocated_capacity = *psVar2;
        local_60._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_60._M_string_length = plVar1[1];
      *plVar1 = (long)psVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    else {
      local_60._M_dataplus._M_p._0_1_ = c;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    if (c == '\0') {
      return;
    }
    goto LAB_00139764;
  case 7:
    pcVar4 = "\\a";
    break;
  case 8:
    pcVar4 = "\\b";
    break;
  case 9:
    pcVar4 = "\\t";
    break;
  case 10:
    pcVar4 = "\\n";
    break;
  case 0xb:
    pcVar4 = "\\v";
    break;
  case 0xc:
    pcVar4 = "\\f";
    break;
  case 0xd:
    pcVar4 = "\\r";
    break;
  default:
    if (iVar3 == 0x27) {
      pcVar4 = "\\\'";
    }
    else {
      if (iVar3 != 0x5c) goto switchD_00139659_caseD_1;
      pcVar4 = "\\\\";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  bVar5 = false;
LAB_00139764:
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  std::ostream::operator<<((ostream *)os,(int)c);
  pcVar4 = ")";
  if (9 < (byte)c && !bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", 0x",4);
    String::FormatHexInt_abi_cxx11_(&local_60,(String *)(ulong)(byte)c,value_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
LAB_001397e1:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,1);
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}